

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int lhMoveLocalCell(lhcell *pCell,sxu16 iOfft,void *pData,unqlite_int64 nData)

{
  sxu16 sVar1;
  ushort uVar2;
  sxu16 sVar3;
  lhcell *plVar4;
  int iVar5;
  undefined1 *puVar6;
  lhcell *plVar7;
  
  sVar1 = pCell->iStart;
  plVar4 = (lhcell *)pCell->pPage;
  for (plVar7 = (*(lhpage **)&plVar4->sKey)->pFirst; plVar7 != (lhcell *)0x0; plVar7 = plVar7->pPrev
      ) {
    if (((lhcell *)plVar7->pPage == plVar4) && (((lhphdr *)&plVar7->iNext)->iOfft == sVar1))
    goto LAB_001150b6;
  }
  plVar7 = (lhcell *)0x0;
LAB_001150b6:
  puVar6 = *(undefined1 **)plVar4->nData;
  if (plVar7 == (lhcell *)0x0) {
    sVar3 = pCell->iNext;
    puVar6[1] = (char)sVar3;
    plVar7 = plVar4;
  }
  else {
    uVar2 = plVar7->iStart;
    sVar3 = pCell->iNext;
    puVar6[(ulong)uVar2 + 0x11] = (char)sVar3;
    puVar6 = puVar6 + (ulong)uVar2 + 0x10;
  }
  *puVar6 = (char)(sVar3 >> 8);
  ((lhphdr *)&plVar7->iNext)->iOfft = pCell->iNext;
  pCell->iStart = iOfft;
  pCell->nData = nData;
  lhCellWriteLocalPayload
            (pCell,(void *)((ulong)(ushort)(sVar1 + 0x1a) + *(long *)plVar4->nData),pCell->nKey,
             pData,nData);
  iVar5 = lhCellWriteHeader(pCell);
  return iVar5;
}

Assistant:

static int lhMoveLocalCell(
	lhcell *pCell,
	sxu16 iOfft,
	const void *pData,
	unqlite_int64 nData
	)
{
	sxu16 iKeyOfft = pCell->iStart + L_HASH_CELL_SZ;
	lhpage *pPage = pCell->pPage;
	lhcell *pSibeling;
	pSibeling = lhFindSibeling(pCell);
	if( pSibeling ){
		/* Fix link */
		SyBigEndianPack16(&pPage->pRaw->zData[pSibeling->iStart + 4/*Hash*/+4/*Key*/+8/*Data*/],pCell->iNext);
		pSibeling->iNext = pCell->iNext;
	}else{
		/* First cell, update page header only */
		SyBigEndianPack16(pPage->pRaw->zData,pCell->iNext);
		pPage->sHdr.iOfft = pCell->iNext;
	}
	/* Set the new offset */
	pCell->iStart = iOfft;
	pCell->nData = (sxu64)nData;
	/* Write the cell payload */
	lhCellWriteLocalPayload(pCell,(const void *)&pPage->pRaw->zData[iKeyOfft],pCell->nKey,pData,nData);
	/* Finally write the cell header */
	lhCellWriteHeader(pCell);
	/* All done */
	return UNQLITE_OK;
}